

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

void __thiscall Fl_Tree_Item::Fl_Tree_Item(Fl_Tree_Item *this,Fl_Tree_Item *o)

{
  void *pvVar1;
  Fl_Fontsize FVar2;
  Fl_Color FVar3;
  Fl_Color FVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char *pcVar8;
  
  Fl_Tree_Item_Array::Fl_Tree_Item_Array(&this->_children,10);
  if (o->_label == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = strdup(o->_label);
  }
  this->_label = pcVar8;
  FVar2 = o->_labelsize;
  FVar3 = o->_labelfgcolor;
  FVar4 = o->_labelbgcolor;
  this->_labelfont = o->_labelfont;
  this->_labelsize = FVar2;
  this->_labelfgcolor = FVar3;
  this->_labelbgcolor = FVar4;
  this->_widget = o->_widget;
  cVar5 = o->_visible;
  cVar6 = o->_active;
  cVar7 = o->_selected;
  this->_open = o->_open;
  this->_visible = cVar5;
  this->_active = cVar6;
  this->_selected = cVar7;
  this->_xywh[0] = o->_xywh[0];
  this->_xywh[1] = o->_xywh[1];
  this->_xywh[2] = o->_xywh[2];
  this->_xywh[3] = o->_xywh[3];
  this->_collapse_xywh[0] = o->_collapse_xywh[0];
  this->_collapse_xywh[1] = o->_collapse_xywh[1];
  this->_collapse_xywh[2] = o->_collapse_xywh[2];
  this->_collapse_xywh[3] = o->_collapse_xywh[3];
  this->_label_xywh[0] = o->_label_xywh[0];
  this->_label_xywh[1] = o->_label_xywh[1];
  this->_label_xywh[2] = o->_label_xywh[2];
  this->_label_xywh[3] = o->_label_xywh[3];
  this->_usericon = o->_usericon;
  pvVar1 = o->_userdata;
  this->_parent = o->_parent;
  this->_userdata = pvVar1;
  return;
}

Assistant:

Fl_Tree_Item::Fl_Tree_Item(const Fl_Tree_Item *o) {
#if FLTK_ABI_VERSION >= 10303
  _tree             = o->_tree;
#endif
  _label        = o->label() ? strdup(o->label()) : 0;
  _labelfont    = o->labelfont();
  _labelsize    = o->labelsize();
  _labelfgcolor = o->labelfgcolor();
  _labelbgcolor = o->labelbgcolor();
  _widget       = o->widget();
#if FLTK_ABI_VERSION >= 10301
  _flags        = o->_flags;
#else /*FLTK_ABI_VERSION*/
  _open         = o->_open;
  _visible      = o->_visible;
  _active       = o->_active;
  _selected     = o->_selected;
#endif /*FLTK_ABI_VERSION*/
  _xywh[0]      = o->_xywh[0];
  _xywh[1]      = o->_xywh[1];
  _xywh[2]      = o->_xywh[2];
  _xywh[3]      = o->_xywh[3];
  _collapse_xywh[0] = o->_collapse_xywh[0];
  _collapse_xywh[1] = o->_collapse_xywh[1];
  _collapse_xywh[2] = o->_collapse_xywh[2];
  _collapse_xywh[3] = o->_collapse_xywh[3];
  _label_xywh[0]    = o->_label_xywh[0];
  _label_xywh[1]    = o->_label_xywh[1];
  _label_xywh[2]    = o->_label_xywh[2];
  _label_xywh[3]    = o->_label_xywh[3];
  _usericon         = o->usericon();
  _userdata         = o->user_data();
  _parent           = o->_parent;
#if FLTK_ABI_VERSION >= 10301
  _prev_sibling     = 0;		// do not copy ptrs! use update_prev_next()
  _next_sibling     = 0;		// do not copy ptrs! use update_prev_next()
#endif /*FLTK_ABI_VERSION*/
}